

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like_optimizations.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::LikeOptimizationRule::ApplyRule
          (LikeOptimizationRule *this,BoundFunctionExpression *expr,ScalarFunction *function,
          string *pattern,bool is_not_like)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _func_int **pp_Var2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  undefined1 auVar4 [8];
  undefined8 uVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  pointer pBVar7;
  reference pvVar8;
  pointer pBVar9;
  undefined7 in_register_00000081;
  string *psVar10;
  char in_R9B;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_90;
  undefined1 local_88 [8];
  Value local_80;
  string local_40;
  
  psVar10 = (string *)CONCAT71(in_register_00000081,is_not_like);
  (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
  local_80.type_._0_8_ = (element_type *)0x0;
  make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType&,duckdb::ScalarFunction,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,decltype(nullptr)>
            ((LogicalType *)local_88,
             (ScalarFunction *)
             &(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.extra_info.
              field_2,(vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                       *)pattern,
             &function[1].super_BaseScalarFunction.super_SimpleFunction.arguments.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_80.type_.id_ = 0x25;
  _Var6 = ::std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (*(char **)psVar10,*(char **)psVar10 + *(long *)(psVar10 + 8),
                     (_Iter_equals_val<const_char>)(local_88 + 8));
  ::std::__cxx11::string::erase(psVar10,_Var6._M_current,*(long *)psVar10 + *(long *)(psVar10 + 8));
  ::std::__cxx11::string::string((string *)&local_40,psVar10);
  Value::Value((Value *)(local_88 + 8),&local_40);
  make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
            ((duckdb *)&local_90,(Value *)(local_88 + 8));
  _Var3._M_head_impl = local_90._M_head_impl;
  local_90._M_head_impl = (Expression *)0x0;
  pBVar7 = unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
                         *)local_88);
  pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(&pBVar7->children,1);
  _Var1._M_head_impl =
       (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (_Var1._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
  }
  if (local_90._M_head_impl != (Expression *)0x0) {
    (*((local_90._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_90._M_head_impl = (Expression *)0x0;
  Value::~Value((Value *)(local_88 + 8));
  ::std::__cxx11::string::~string((string *)&local_40);
  auVar4 = local_88;
  local_88 = (undefined1  [8])0x0;
  pp_Var2 = (this->super_Rule)._vptr_Rule;
  (this->super_Rule)._vptr_Rule = (_func_int **)auVar4;
  if (pp_Var2 != (_func_int **)0x0) {
    (**(code **)(*pp_Var2 + 8))();
  }
  if (in_R9B != '\0') {
    local_90._M_head_impl._0_1_ = 0xd;
    make_uniq<duckdb::BoundOperatorExpression,duckdb::ExpressionType,duckdb::LogicalTypeId_const&>
              ((duckdb *)(local_88 + 8),(ExpressionType *)&local_90,&LogicalType::BOOLEAN);
    pBVar9 = unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
             ::operator->((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                           *)(local_88 + 8));
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&pBVar9->children,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)this
              );
    uVar5 = local_80.type_._0_8_;
    local_80.type_._0_8_ = (element_type *)0x0;
    pp_Var2 = (this->super_Rule)._vptr_Rule;
    (this->super_Rule)._vptr_Rule = (_func_int **)uVar5;
    if (pp_Var2 != (_func_int **)0x0) {
      (**(code **)(*pp_Var2 + 8))();
      if ((element_type *)local_80.type_._0_8_ != (element_type *)0x0) {
        (*(*(_func_int ***)local_80.type_._0_8_)[1])();
      }
    }
  }
  if ((_Head_base<0UL,_duckdb::BoundFunctionExpression_*,_false>)local_88 !=
      (_Head_base<0UL,_duckdb::BoundFunctionExpression_*,_false>)0x0) {
    (*(((Expression *)local_88)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> LikeOptimizationRule::ApplyRule(BoundFunctionExpression &expr, ScalarFunction function,
                                                       string pattern, bool is_not_like) {
	// replace LIKE by an optimized function
	unique_ptr<Expression> result;
	auto new_function =
	    make_uniq<BoundFunctionExpression>(expr.return_type, std::move(function), std::move(expr.children), nullptr);

	// removing "%" from the pattern
	pattern.erase(std::remove(pattern.begin(), pattern.end(), '%'), pattern.end());

	new_function->children[1] = make_uniq<BoundConstantExpression>(Value(std::move(pattern)));

	result = std::move(new_function);
	if (is_not_like) {
		auto negation = make_uniq<BoundOperatorExpression>(ExpressionType::OPERATOR_NOT, LogicalType::BOOLEAN);
		negation->children.push_back(std::move(result));
		result = std::move(negation);
	}

	return result;
}